

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall mario::TimerQueue::handleRead(TimerQueue *this)

{
  bool bVar1;
  pointer ppVar2;
  __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
  local_48;
  __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
  local_40;
  iterator it;
  undefined1 local_30 [8];
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  expired;
  Timestamp now;
  TimerQueue *this_local;
  
  EventLoop::assertInLoopThread(this->_loop);
  expired.
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Timestamp::now();
  detail::readTimerfd(this->_timerfd);
  it._M_current =
       expired.
       super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  getExpired((vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
              *)local_30,this,
             (Timestamp)
             expired.
             super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this->_callingExpiredTimers = true;
  std::
  set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::clear(&this->_cancelingTimers);
  local_40._M_current =
       (pair<mario::Timestamp,_mario::Timer_*> *)
       std::
       vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
       ::begin((vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                *)local_30);
  while( true ) {
    local_48._M_current =
         (pair<mario::Timestamp,_mario::Timer_*> *)
         std::
         vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
         ::end((vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                *)local_30);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
             ::operator->(&local_40);
    Timer::run(ppVar2->second);
    __gnu_cxx::
    __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
    ::operator++(&local_40);
  }
  this->_callingExpiredTimers = false;
  reset(this,(vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
              *)local_30,
        (Timestamp)
        expired.
        super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::~vector((vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
             *)local_30);
  return;
}

Assistant:

void TimerQueue::handleRead() {
    _loop->assertInLoopThread();
    Timestamp now(Timestamp::now());
    readTimerfd(_timerfd);

    std::vector<Entry> expired = getExpired(now);

    _callingExpiredTimers = true;
    _cancelingTimers.clear();
    for (auto it = expired.begin(); it != expired.end(); ++it) {
        it->second->run();
    }
    _callingExpiredTimers = false;

    reset(expired, now);
}